

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_commit.cxx
# Opt level: O2

void __thiscall
nuraft::raft_server::commit_conf(raft_server *this,ulong idx_to_commit,ptr<log_entry> *le)

{
  element_type *peVar1;
  element_type *peVar2;
  int iVar3;
  buffer *pbVar4;
  ptr<cluster_config> new_conf;
  ptr<cluster_config> cur_conf;
  undefined1 local_50 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  unique_lock<std::recursive_mutex> guard;
  uint64_t log_idx;
  
  std::unique_lock<std::recursive_mutex>::unique_lock(&guard,&this->lock_);
  pbVar4 = log_entry::get_buf((le->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>
                              )._M_ptr);
  buffer::pos(pbVar4,0);
  pbVar4 = log_entry::get_buf((le->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>
                              )._M_ptr);
  cluster_config::deserialize((cluster_config *)&new_conf,pbVar4);
  get_config((raft_server *)&cur_conf);
  peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1 != (element_type *)0x0) {
    iVar3 = (**(code **)(*(long *)peVar1 + 0x38))();
    if (3 < iVar3) {
      peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      msg_if_given_abi_cxx11_
                ((string *)local_50,"config at index %lu is committed, prev config log idx %lu",
                 (new_conf.super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->log_idx_,
                 (cur_conf.super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->log_idx_);
      (**(code **)(*(long *)peVar1 + 0x40))
                (peVar1,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_commit.cxx"
                 ,"commit_conf",0x19a,local_50);
      std::__cxx11::string::~string((string *)local_50);
    }
  }
  this->config_changing_ = false;
  if ((cur_conf.super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      log_idx_ <
      (new_conf.super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      log_idx_) {
    (**(code **)(**(long **)&(((this->ctx_)._M_t.
                               super___uniq_ptr_impl<nuraft::context,_std::default_delete<nuraft::context>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_nuraft::context_*,_std::default_delete<nuraft::context>_>
                               .super__Head_base<0UL,_nuraft::context_*,_false>._M_head_impl)->
                             state_mgr_).
                             super___shared_ptr<nuraft::state_mgr,_(__gnu_cxx::_Lock_policy)2> +
                0x18))();
    reconfigure(this,&new_conf);
  }
  else {
    peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (peVar1 != (element_type *)0x0) {
      iVar3 = (**(code **)(*(long *)peVar1 + 0x38))();
      if (3 < iVar3) {
        peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        msg_if_given_abi_cxx11_
                  ((string *)local_50,"skipped config %lu, latest config %lu",
                   (new_conf.super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->log_idx_,
                   (cur_conf.super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->log_idx_);
        (**(code **)(*(long *)peVar1 + 0x40))
                  (peVar1,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_commit.cxx"
                   ,"commit_conf",0x1a3,local_50);
        std::__cxx11::string::~string((string *)local_50);
      }
    }
  }
  local_50._0_4_ = this->id_;
  local_50._4_4_ = (this->leader_).super___atomic_base<int>._M_i;
  local_50._8_4_ = 0xffffffff;
  local_40._M_allocated_capacity = (size_type)&log_idx;
  log_idx = idx_to_commit;
  cb_func::call(&((this->ctx_)._M_t.
                  super___uniq_ptr_impl<nuraft::context,_std::default_delete<nuraft::context>_>._M_t
                  .super__Tuple_impl<0UL,_nuraft::context_*,_std::default_delete<nuraft::context>_>.
                  super__Head_base<0UL,_nuraft::context_*,_false>._M_head_impl)->cb_func_,NewConfig,
                (Param *)local_50);
  peVar2 = (this->state_machine_).
           super___shared_ptr<nuraft::state_machine,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (**(code **)(*(long *)peVar2 + 0x20))(peVar2,idx_to_commit,&new_conf);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&cur_conf.super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&new_conf.super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&guard);
  return;
}

Assistant:

void raft_server::commit_conf(ulong idx_to_commit,
                              ptr<log_entry>& le) {
    recur_lock(lock_);
    le->get_buf().pos(0);
    ptr<cluster_config> new_conf =
        cluster_config::deserialize(le->get_buf());

    ptr<cluster_config> cur_conf = get_config();
    p_in( "config at index %" PRIu64 " is committed, prev config log idx %" PRIu64 "",
          new_conf->get_log_idx(), cur_conf->get_log_idx() );

    config_changing_ = false;
    if (cur_conf->get_log_idx() < new_conf->get_log_idx()) {
        // WARNING: Should not overwrite newer config with older one.
        ctx_->state_mgr_->save_config(*new_conf);
        reconfigure(new_conf);
    } else {
        p_in( "skipped config %" PRIu64 ", latest config %" PRIu64 "",
              new_conf->get_log_idx(), cur_conf->get_log_idx() );
    }

    cb_func::Param param(id_, leader_);
    uint64_t log_idx = idx_to_commit;
    param.ctx = &log_idx;
    ctx_->cb_func_.call(cb_func::NewConfig, &param);

    state_machine_->commit_config(idx_to_commit, new_conf);

    // Modified by Jung-Sang Ahn, May 18 2018:
    //   This causes an endless catch-up issue when we add a new node,
    //   as configuration always has itself in it.
    //   Instead, we can clear catch-up flag when this node receives
    //   normal append_entries() request, as receiving log entry
    //   means that catch-up process is already done.
    //
    // if (catching_up_ && new_conf->get_server(id_) != nilptr) {
    //     p_in("this server is committed as one of cluster members");
    //     catching_up_ = false;
    // }
}